

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::JoinMulticastGroup(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  RTPMemoryManager *pRVar1;
  HashElement *pHVar2;
  bool bVar3;
  int iVar4;
  HashElement *pHVar5;
  uint uVar6;
  uint32_t mcastIP;
  ip_mreq mreq;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  if (this->init != true) {
    return -0x5a;
  }
  if (this->created != true) {
    return -0x59;
  }
  if (addr->addresstype != IPv4Address) {
    return -0x54;
  }
  local_24 = *(uint *)&addr->field_0xc;
  if ((local_24 & 0xf0000000) != 0xe0000000) {
    return -0x58;
  }
  uVar6 = local_24 % 0x207d;
  pHVar5 = (this->multicastgroups).table[uVar6];
  if (pHVar5 != (HashElement *)0x0) {
    bVar3 = false;
    do {
      if (pHVar5->element == local_24) {
        bVar3 = true;
      }
      else {
        pHVar5 = pHVar5->hashnext;
      }
    } while ((!bVar3) && (pHVar5 != (HashElement *)0x0));
    if (bVar3) {
      iVar4 = -4;
      bVar3 = false;
      goto LAB_00122ce8;
    }
  }
  pRVar1 = (this->multicastgroups).super_RTPMemoryObject.mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    pHVar5 = (HashElement *)operator_new(0x28);
  }
  else {
    pHVar5 = (HashElement *)
             (**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x28,(this->multicastgroups).memorytype);
  }
  pHVar5->element = local_24;
  pHVar5->hashprev = (HashElement *)0x0;
  pHVar5->hashnext = (HashElement *)0x0;
  pHVar5->listprev = (HashElement *)0x0;
  pHVar5->listnext = (HashElement *)0x0;
  pHVar5->hashindex = uVar6;
  pHVar2 = (this->multicastgroups).table[uVar6];
  (this->multicastgroups).table[uVar6] = pHVar5;
  pHVar5->hashnext = pHVar2;
  if (pHVar2 != (HashElement *)0x0) {
    pHVar2->hashprev = pHVar5;
  }
  if ((this->multicastgroups).firsthashelem == (HashElement *)0x0) {
    (this->multicastgroups).firsthashelem = pHVar5;
  }
  else {
    pHVar2 = (this->multicastgroups).lasthashelem;
    pHVar2->listnext = pHVar5;
    pHVar5->listprev = pHVar2;
  }
  (this->multicastgroups).lasthashelem = pHVar5;
  iVar4 = 0;
  bVar3 = true;
LAB_00122ce8:
  if (!bVar3) {
    return iVar4;
  }
  local_20 = local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
             local_24 << 0x18;
  uVar6 = this->mcastifaceIP;
  local_1c = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  iVar4 = setsockopt(this->rtpsock,0,0x23,&local_20,8);
  if (iVar4 == 0) {
    if (this->rtpsock == this->rtcpsock) {
      return 0;
    }
    local_20 = local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
               local_24 << 0x18;
    uVar6 = this->mcastifaceIP;
    local_1c = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    iVar4 = setsockopt(this->rtcpsock,0,0x23,&local_20,8);
    if (iVar4 == 0) {
      return 0;
    }
    local_20 = local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
               local_24 << 0x18;
    uVar6 = this->mcastifaceIP;
    local_1c = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    setsockopt(this->rtpsock,0,0x24,&local_20,8);
  }
  RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
  DeleteElement(&this->multicastgroups,&local_24);
  return -0x51;
}

Assistant:

int RTPUDPv4Transmitter::JoinMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	uint32_t mcastIP = address.GetIP();
	
	if (!RTPUDPV4TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.AddElement(mcastIP);
	if (status >= 0)
	{
		RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_ADD_MEMBERSHIP,mcastIP,status);
		if (status != 0)
		{
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_COULDNTJOINMULTICASTGROUP;
		}

		if (rtpsock != rtcpsock) // no need to join multicast group twice when multiplexing
		{
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_ADD_MEMBERSHIP,mcastIP,status);
			if (status != 0)
			{
				RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
				multicastgroups.DeleteElement(mcastIP);
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_COULDNTJOINMULTICASTGROUP;
			}
		}
	}
	MAINMUTEX_UNLOCK	
	return status;
}